

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O2

Block * __thiscall
wasm::I64ToI32Lowering::lowerShift
          (I64ToI32Lowering *this,BinaryOp op,Block *result,TempVar *leftLow,TempVar *leftHigh,
          TempVar *rightLow,TempVar *rightHigh)

{
  Builder *pBVar1;
  Builder *pBVar2;
  Index IVar3;
  Index IVar4;
  Index IVar5;
  Index shift_00;
  LocalGet *pLVar6;
  Const *pCVar7;
  Binary *pBVar8;
  LocalSet *append;
  Const *right;
  Block *pBVar9;
  Binary *pBVar10;
  Binary *widthLessShift;
  Block *ifFalse;
  If *args;
  undefined4 in_register_00000034;
  ulong uVar11;
  optional<wasm::Type> type;
  undefined1 local_88 [8];
  TempVar shift;
  
  shift.ty.id = CONCAT44(in_register_00000034,op);
  if (op - ShlInt64 < 3) {
    getTemp((TempVar *)local_88,this,(Type)0x2);
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_88);
    pBVar2 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar4 = TempVar::operator_cast_to_unsigned_int(rightLow);
    pLVar6 = Builder::makeLocalGet(pBVar2,IVar4,(Type)0x2);
    pCVar7 = Builder::makeConst<int>
                       ((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0x1f);
    pBVar8 = Builder::makeBinary(pBVar2,AndInt32,(Expression *)pLVar6,(Expression *)pCVar7);
    append = Builder::makeLocalSet(pBVar1,IVar3,(Expression *)pBVar8);
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    pCVar7 = Builder::makeConst<int>(pBVar1,0x20);
    pBVar2 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int(rightLow);
    pLVar6 = Builder::makeLocalGet(pBVar2,IVar3,(Type)0x2);
    right = Builder::makeConst<int>
                      ((this->builder)._M_t.
                       super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                       _M_t.
                       super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                       super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0x3f);
    pBVar8 = Builder::makeBinary(pBVar2,AndInt32,(Expression *)pLVar6,(Expression *)right);
    pBVar8 = Builder::makeBinary(pBVar1,LeUInt32,(Expression *)pCVar7,(Expression *)pBVar8);
    IVar3 = TempVar::operator_cast_to_unsigned_int(rightHigh);
    if ((int)shift.ty.id == 0x23) {
      IVar4 = TempVar::operator_cast_to_unsigned_int(leftLow);
      IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_88);
      pBVar9 = makeLargeShl(this,IVar3,IVar4,IVar5);
    }
    else if ((int)shift.ty.id == 0x24) {
      IVar4 = TempVar::operator_cast_to_unsigned_int(leftHigh);
      IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_88);
      pBVar9 = makeLargeShrS(this,IVar3,IVar4,IVar5);
    }
    else {
      IVar4 = TempVar::operator_cast_to_unsigned_int(leftHigh);
      IVar5 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_88);
      pBVar9 = makeLargeShrU(this,IVar3,IVar4,IVar5);
    }
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    pCVar7 = Builder::makeConst<int>(pBVar1,1);
    pBVar2 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_88);
    pLVar6 = Builder::makeLocalGet(pBVar2,IVar3,(Type)0x2);
    pBVar10 = Builder::makeBinary(pBVar1,ShlInt32,(Expression *)pCVar7,(Expression *)pLVar6);
    pCVar7 = Builder::makeConst<int>
                       ((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,1);
    pBVar10 = Builder::makeBinary(pBVar1,SubInt32,(Expression *)pBVar10,(Expression *)pCVar7);
    pBVar1 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    pCVar7 = Builder::makeConst<int>(pBVar1,0x20);
    pBVar2 = (this->builder)._M_t.
             super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t.
             super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
             super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl;
    IVar3 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_88);
    pLVar6 = Builder::makeLocalGet(pBVar2,IVar3,(Type)0x2);
    widthLessShift = Builder::makeBinary(pBVar1,SubInt32,(Expression *)pCVar7,(Expression *)pLVar6);
    IVar3 = TempVar::operator_cast_to_unsigned_int(rightHigh);
    IVar4 = TempVar::operator_cast_to_unsigned_int(leftLow);
    IVar5 = TempVar::operator_cast_to_unsigned_int(leftHigh);
    shift_00 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_88);
    if ((int)shift.ty.id == 0x23) {
      uVar11 = (ulong)shift_00;
      ifFalse = makeSmallShl(this,IVar3,IVar4,IVar5,shift_00,pBVar10,widthLessShift);
    }
    else if ((int)shift.ty.id == 0x24) {
      uVar11 = (ulong)shift_00;
      ifFalse = makeSmallShrS(this,IVar3,IVar4,IVar5,shift_00,pBVar10,widthLessShift);
    }
    else {
      uVar11 = (ulong)shift_00;
      ifFalse = makeSmallShrU(this,IVar3,IVar4,IVar5,shift_00,pBVar10,widthLessShift);
    }
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._8_8_ = 0;
    type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
    super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)uVar11;
    args = Builder::makeIf((this->builder)._M_t.
                           super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                           .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                           (Expression *)pBVar8,(Expression *)pBVar9,(Expression *)ifFalse,type);
    pBVar9 = Builder::blockify<wasm::If*>
                       ((this->builder)._M_t.
                        super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>
                        .super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,
                        (Expression *)result,(Expression *)append,args);
    setOutParam(this,(Expression *)pBVar9,rightHigh);
    TempVar::~TempVar((TempVar *)local_88);
    return pBVar9;
  }
  __assert_fail("op == ShlInt64 || op == ShrUInt64 || op == ShrSInt64",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/I64ToI32Lowering.cpp"
                ,0x4bc,
                "Block *wasm::I64ToI32Lowering::lowerShift(BinaryOp, Block *, TempVar &&, TempVar &&, TempVar &&, TempVar &&)"
               );
}

Assistant:

Block* lowerShift(BinaryOp op,
                    Block* result,
                    TempVar&& leftLow,
                    TempVar&& leftHigh,
                    TempVar&& rightLow,
                    TempVar&& rightHigh) {
    assert(op == ShlInt64 || op == ShrUInt64 || op == ShrSInt64);
    // shift left lowered as:
    // if 32 <= rightLow % 64:
    //     high = leftLow << k; low = 0
    // else:
    //     high = (((1 << k) - 1) & (leftLow >> (32 - k))) | (leftHigh << k);
    //     low = leftLow << k
    // where k = shift % 32. shift right is similar.
    TempVar shift = getTemp();
    LocalSet* setShift = builder->makeLocalSet(
      shift,
      builder->makeBinary(AndInt32,
                          builder->makeLocalGet(rightLow, Type::i32),
                          builder->makeConst(int32_t(32 - 1))));
    Binary* isLargeShift = builder->makeBinary(
      LeUInt32,
      builder->makeConst(int32_t(32)),
      builder->makeBinary(AndInt32,
                          builder->makeLocalGet(rightLow, Type::i32),
                          builder->makeConst(int32_t(64 - 1))));
    Block* largeShiftBlock;
    switch (op) {
      case ShlInt64:
        largeShiftBlock = makeLargeShl(rightHigh, leftLow, shift);
        break;
      case ShrSInt64:
        largeShiftBlock = makeLargeShrS(rightHigh, leftHigh, shift);
        break;
      case ShrUInt64:
        largeShiftBlock = makeLargeShrU(rightHigh, leftHigh, shift);
        break;
      default:
        abort();
    }
    Binary* shiftMask = builder->makeBinary(
      SubInt32,
      builder->makeBinary(ShlInt32,
                          builder->makeConst(int32_t(1)),
                          builder->makeLocalGet(shift, Type::i32)),
      builder->makeConst(int32_t(1)));
    Binary* widthLessShift =
      builder->makeBinary(SubInt32,
                          builder->makeConst(int32_t(32)),
                          builder->makeLocalGet(shift, Type::i32));
    Block* smallShiftBlock;
    switch (op) {
      case ShlInt64: {
        smallShiftBlock = makeSmallShl(
          rightHigh, leftLow, leftHigh, shift, shiftMask, widthLessShift);
        break;
      }
      case ShrSInt64: {
        smallShiftBlock = makeSmallShrS(
          rightHigh, leftLow, leftHigh, shift, shiftMask, widthLessShift);
        break;
      }
      case ShrUInt64: {
        smallShiftBlock = makeSmallShrU(
          rightHigh, leftLow, leftHigh, shift, shiftMask, widthLessShift);
        break;
      }
      default:
        abort();
    }
    If* ifLargeShift =
      builder->makeIf(isLargeShift, largeShiftBlock, smallShiftBlock);
    result = builder->blockify(result, setShift, ifLargeShift);
    setOutParam(result, std::move(rightHigh));
    return result;
  }